

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_pax.c
# Opt level: O3

void test_acl_pax_nfs4(void)

{
  longlong v1;
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  archive_entry *entry;
  FILE *__s;
  size_t v2;
  char *__ptr;
  size_t used;
  archive_entry *ae;
  size_t reference_size;
  uint local_48;
  undefined4 uStack_44;
  archive_entry *local_40;
  size_t local_38;
  
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ő',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_write_new())",
                   (void *)0x0);
  iVar1 = archive_write_set_format_pax(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ő',(uint)(iVar1 == 0),"0 == archive_write_set_format_pax(a)",paVar3);
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Œ',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_set_bytes_per_block(paVar3,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'œ',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",paVar3);
  iVar1 = archive_write_set_bytes_in_last_block(paVar3,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ŕ',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",
                   paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,0x4000,(size_t *)&local_48);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ŕ',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  entry = archive_entry_new();
  local_40 = entry;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ś',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81ff);
  assertion_entry_set_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
             ,L'ş',entry,(archive_test_acl_t *)acls3,L'\x03');
  iVar1 = archive_write_header(paVar3,entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Š',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar3);
  assertion_entry_set_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
             ,L'ţ',entry,(archive_test_acl_t *)acls4,L'\x06');
  iVar1 = archive_write_header(paVar3,entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ť',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar3);
  assertion_entry_set_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
             ,L'ŧ',entry,(archive_test_acl_t *)acls5,L'\x06');
  iVar1 = archive_write_header(paVar3,entry);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ũ',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar3);
  archive_entry_free(entry);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'ŭ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ů',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  __s = fopen("testout","wb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ű',(uint)(__s != (FILE *)0x0),"NULL != (f = fopen(\"testout\", \"wb\"))",
                   (void *)0x0);
  v1 = CONCAT44(uStack_44,local_48);
  v2 = fwrite(buff,1,(ulong)local_48,__s);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ų',v1,"used",v2,"(size_t)fwrite(buff, 1, (unsigned int)used, f)",
                      (void *)0x0);
  fclose(__s);
  extract_reference_file("test_acl_pax_nfs4.tar");
  __ptr = slurpfile(&local_38,"test_acl_pax_nfs4.tar");
  failure(
         "Generated pax archive does not match reference; compare \'testout\' to \'test_acl_pax_nfs4.tar\' reference file."
         );
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ż',buff,"buff",__ptr,"reference",local_38,"reference_size",(void *)0x0);
  failure(
         "Generated pax archive does not match reference; compare \'testout\' to \'test_acl_pax_nfs4.tar\' reference file."
         );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ž',(long)(int)local_48,"(int)used",local_38,"reference_size",(void *)0x0);
  free(__ptr);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ɓ',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ƃ',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ƃ',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,buff,CONCAT44(uStack_44,local_48));
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ƅ',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, used)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ƈ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
  wVar2 = archive_entry_acl_reset(local_40,L'Ѐ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ɖ',3,"3",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ALLOW)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
             ,L'Ƌ',local_40,(archive_test_acl_t *)acls3,L'\x03',L'Ѐ',L'\0');
  iVar1 = archive_read_next_header(paVar3,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'Ǝ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
  wVar2 = archive_entry_acl_reset(local_40,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ɛ',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
             ,L'ƒ',local_40,(archive_test_acl_t *)acls4,L'\x06',L'㰀',L'\0');
  iVar1 = archive_read_next_header(paVar3,&local_40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                   ,L'ƕ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar3);
  wVar2 = archive_entry_acl_reset(local_40,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ɨ',6,"6",(long)wVar2,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
             ,L'ƙ',local_40,(archive_test_acl_t *)acls5,L'\x06',L'㰀',L'\0');
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ɯ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_acl_pax.c"
                      ,L'Ɲ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_acl_pax_nfs4)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t used;
	FILE *f;
	void *reference;
	size_t reference_size;

	/* Write an archive to memory. */
	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Write a series of files to the archive with different ACL info. */

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "file");
        archive_entry_set_mode(ae, S_IFREG | 0777);

	/* NFS4 ACLs mirroring 0754 file mode */
	assertEntrySetAcls(ae, acls3, sizeof(acls3)/sizeof(acls3[0]));
	assertA(0 == archive_write_header(a, ae));

	/* A more extensive set of NFS4 ACLs. */
	assertEntrySetAcls(ae, acls4, sizeof(acls4)/sizeof(acls4[0]));
	assertA(0 == archive_write_header(a, ae));

	/* Set with special (audit, alarm) NFS4 ACLs. */
	assertEntrySetAcls(ae, acls5, sizeof(acls5)/sizeof(acls5[0]));
	assertA(0 == archive_write_header(a, ae));

	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Write out the data we generated to a file for manual inspection. */
	assert(NULL != (f = fopen("testout", "wb")));
	assertEqualInt(used, (size_t)fwrite(buff, 1, (unsigned int)used, f));
	fclose(f);

	/* Write out the reference data to a file for manual inspection. */
	extract_reference_file("test_acl_pax_nfs4.tar");
	reference = slurpfile(&reference_size, "test_acl_pax_nfs4.tar");

	/* Assert that the generated data matches the built-in reference data.*/
	failure("Generated pax archive does not match reference; compare 'testout' to 'test_acl_pax_nfs4.tar' reference file.");
	assertEqualMem(buff, reference, reference_size);
	failure("Generated pax archive does not match reference; compare 'testout' to 'test_acl_pax_nfs4.tar' reference file.");
	assertEqualInt((int)used, reference_size);
	free(reference);

	/* Read back each entry and check that the ACL data is right. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	/* First item has NFS4 ACLs mirroring file mode */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(3, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ALLOW));
	assertEntryCompareAcls(ae, acls3, sizeof(acls3)/sizeof(acls3[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ALLOW, 0);

	/* Second item has has more fine-grained NFS4 ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls4, sizeof(acls4)/sizeof(acls4[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);

	/* Third item has has audit and alarm NFS4 ACLs */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls5, sizeof(acls5)/sizeof(acls5[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}